

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::free_data(Fl_Help_View *this)

{
  int iVar1;
  int H;
  char *pcVar2;
  Fl_Shared_Image *this_00;
  void *extraout_RDX;
  void *pvVar3;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  bool bVar4;
  int height;
  int width;
  Fl_Shared_Image *img;
  char local_c38 [8];
  char hattr [1024];
  char wattr [1024];
  char attr [1024];
  HV_Edit_Buffer buf;
  char *attrs;
  char *ptr;
  Fl_Help_View *this_local;
  
  if (this->value_ != (char *)0x0) {
    HV_Edit_Buffer::HV_Edit_Buffer((HV_Edit_Buffer *)(attr + 0x3f8),0x400,0x400);
    attrs = this->value_;
    while (*attrs != '\0') {
      if (*attrs == '<') {
        iVar1 = strncmp(attrs + 1,"!--",3);
        if (iVar1 == 0) {
          pcVar2 = strstr(attrs + 4,"-->");
          if (pcVar2 == (char *)0x0) break;
          attrs = pcVar2 + 3;
        }
        else {
          HV_Edit_Buffer::clear((HV_Edit_Buffer *)(attr + 0x3f8));
          pvVar3 = extraout_RDX;
          attrs = attrs + 1;
          while( true ) {
            pcVar2 = attrs;
            bVar4 = false;
            if ((*attrs != '\0') && (bVar4 = false, *attrs != '>')) {
              iVar1 = isspace((uint)(byte)*attrs);
              bVar4 = iVar1 == 0;
              pvVar3 = extraout_RDX_00;
            }
            if (!bVar4) break;
            HV_Edit_Buffer::add((HV_Edit_Buffer *)(attr + 0x3f8),*attrs);
            pvVar3 = extraout_RDX_01;
            attrs = attrs + 1;
          }
          while( true ) {
            bVar4 = false;
            if (*attrs != '\0') {
              bVar4 = *attrs != '>';
            }
            if (!bVar4) break;
            attrs = attrs + 1;
          }
          if (*attrs == '>') {
            attrs = attrs + 1;
          }
          iVar1 = HV_Edit_Buffer::cmp((HV_Edit_Buffer *)(attr + 0x3f8),"IMG",pvVar3);
          if (iVar1 != 0) {
            get_attr(this,pcVar2,"WIDTH",hattr + 0x3f8,0x400);
            get_attr(this,pcVar2,"HEIGHT",local_c38,0x400);
            iVar1 = get_length(this,hattr + 0x3f8);
            H = get_length(this,local_c38);
            pcVar2 = get_attr(this,pcVar2,"SRC",wattr + 0x3f8,0x400);
            if ((pcVar2 != (char *)0x0) &&
               (this_00 = get_image(this,wattr + 0x3f8,iVar1,H),
               this_00 != (Fl_Shared_Image *)&broken_image)) {
              Fl_Shared_Image::release(this_00);
            }
          }
        }
      }
      else {
        attrs = attrs + 1;
      }
    }
    free(this->value_);
    this->value_ = (char *)0x0;
    HV_Edit_Buffer::~HV_Edit_Buffer((HV_Edit_Buffer *)(attr + 0x3f8));
  }
  if (this->nblocks_ != 0) {
    free(this->blocks_);
    this->ablocks_ = 0;
    this->nblocks_ = 0;
    this->blocks_ = (Fl_Help_Block *)0x0;
  }
  if (this->nlinks_ != 0) {
    free(this->links_);
    this->alinks_ = 0;
    this->nlinks_ = 0;
    this->links_ = (Fl_Help_Link *)0x0;
  }
  if (this->ntargets_ != 0) {
    free(this->targets_);
    this->atargets_ = 0;
    this->ntargets_ = 0;
    this->targets_ = (Fl_Help_Target *)0x0;
  }
  return;
}

Assistant:

void
Fl_Help_View::free_data() {
  // Release all images...
  if (value_) {
    const char	*ptr,		// Pointer into block
		*attrs;		// Pointer to start of element attributes
    HV_Edit_Buffer buf;		// Text buffer
    char	attr[1024],	// Attribute buffer
		wattr[1024],	// Width attribute buffer
		hattr[1024];	// Height attribute buffer

    DEBUG_FUNCTION(__LINE__,__FUNCTION__);

    for (ptr = value_; *ptr;)
    {
      if (*ptr == '<')
      {
	ptr ++;

        if (strncmp(ptr, "!--", 3) == 0)
	{
	  // Comment...
	  ptr += 3;
	  if ((ptr = strstr(ptr, "-->")) != NULL)
	  {
	    ptr += 3;
	    continue;
	  }
	  else
	    break;
	}

        buf.clear();

	while (*ptr && *ptr != '>' && !isspace((*ptr)&255))
	  buf.add(*ptr++);

	attrs = ptr;
	while (*ptr && *ptr != '>')
          ptr ++;

	if (*ptr == '>')
          ptr ++;

	if (buf.cmp("IMG"))
	{
	  Fl_Shared_Image	*img;
	  int		width;
	  int		height;

          get_attr(attrs, "WIDTH", wattr, sizeof(wattr));
          get_attr(attrs, "HEIGHT", hattr, sizeof(hattr));
	  width  = get_length(wattr);
	  height = get_length(hattr);

	  if (get_attr(attrs, "SRC", attr, sizeof(attr))) {
	    // Get and release the image to free it from memory...
	    img = get_image(attr, width, height);
	    if ((void*)img != &broken_image) {
	      img->release();
	    }
	  }
	}
      }
      else
        ptr ++;
    }

    free((void *)value_);
    value_ = 0;
  }

  // Free all of the arrays...
  if (nblocks_) {
    free(blocks_);

    ablocks_ = 0;
    nblocks_ = 0;
    blocks_  = 0;
  }

  if (nlinks_) {
    free(links_);

    alinks_ = 0;
    nlinks_ = 0;
    links_  = 0;
  }

  if (ntargets_) {
    free(targets_);

    atargets_ = 0;
    ntargets_ = 0;
    targets_  = 0;
  }
}